

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TorsionTypeParser.cpp
# Opt level: O0

TorsionType * __thiscall OpenMD::TorsionTypeParser::parseLine(TorsionTypeParser *this,string *line)

{
  TorsionTypeEnum TVar1;
  undefined8 uVar2;
  allocator<char> *__a;
  HarmonicTorsionType *pHVar3;
  long in_RDI;
  TrappeTorsionType *this_00;
  RealType RVar4;
  __type_conflict _Var5;
  RealType d0;
  RealType phi0;
  RealType degreesPerRadian;
  RealType c3;
  RealType c2;
  RealType c1;
  RealType c0;
  RealType v3;
  RealType v2;
  RealType v1;
  bool isOdd_1;
  CharmmTorsionParameter currParam;
  int i_1;
  vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_> parameters
  ;
  int nSets;
  bool isOdd;
  int i;
  PolynomialTorsionType *ptt;
  RealType coefficient;
  int power;
  int nPairs;
  RealType k0_2;
  RealType k1_2;
  RealType k2_2;
  RealType k3_2;
  RealType k4;
  RealType k0_1;
  RealType k1_1;
  RealType k2_1;
  RealType k3_1;
  RealType k0;
  RealType k1;
  RealType k2;
  RealType k3;
  TorsionTypeEnum tt;
  int nTokens;
  TorsionType *torsionType;
  StringTokenizer tokenizer;
  RealType in_stack_fffffffffffffa68;
  int __y;
  StringTokenizer *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  string *msg;
  StringTokenizer *in_stack_fffffffffffffa80;
  string *in_stack_fffffffffffffa88;
  StringTokenizer *in_stack_fffffffffffffa90;
  undefined8 in_stack_fffffffffffffa98;
  string *in_stack_fffffffffffffaa0;
  undefined1 uVar6;
  string *in_stack_fffffffffffffaa8;
  char *__s;
  StringTokenizer *in_stack_fffffffffffffab0;
  RealType in_stack_fffffffffffffab8;
  OplsTorsionType *in_stack_fffffffffffffac0;
  StringTokenizer *in_stack_fffffffffffffb18;
  undefined8 local_4a8;
  vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
  *in_stack_fffffffffffffbb8;
  CharmmTorsionType *in_stack_fffffffffffffbc0;
  string local_371;
  double local_350;
  double local_348;
  double local_340;
  undefined1 local_332;
  char local_331 [33];
  RealType local_310;
  TrappeTorsionType *local_308;
  RealType local_300;
  RealType local_2f8;
  undefined1 local_2ea;
  RealType local_2c8;
  RealType local_2c0;
  RealType local_2b8;
  undefined1 local_2aa;
  byte local_281;
  RealType local_280;
  uint local_278;
  double local_270;
  int local_264;
  int local_248;
  undefined1 local_242;
  byte local_21d;
  int local_21c;
  undefined8 local_218;
  RealType local_210;
  uint local_204;
  int local_200;
  undefined1 local_1fa;
  RealType local_1d8;
  RealType local_1d0;
  RealType local_1c8;
  RealType local_1c0;
  RealType local_1b8;
  undefined1 local_1aa;
  RealType local_188;
  RealType local_180;
  RealType local_178;
  RealType local_170;
  undefined1 local_162;
  RealType local_140;
  RealType local_138;
  RealType local_130;
  RealType local_128;
  undefined1 local_11a;
  string local_f8 [32];
  TorsionTypeEnum local_d8;
  undefined1 local_d2;
  int local_ac;
  HarmonicTorsionType *local_a8;
  allocator<char> local_89;
  string local_88 [136];
  
  uVar6 = (undefined1)((ulong)in_stack_fffffffffffffa98 >> 0x38);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
             (allocator<char> *)in_stack_fffffffffffffaa0);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  local_a8 = (HarmonicTorsionType *)0x0;
  local_ac = StringTokenizer::countTokens(in_stack_fffffffffffffa80);
  if (local_ac < 1) {
    local_d2 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
               (allocator<char> *)in_stack_fffffffffffffaa0);
    OpenMDException::OpenMDException
              ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
    local_d2 = 0;
    __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffb18);
  TVar1 = getTorsionTypeEnum((TorsionTypeParser *)in_stack_fffffffffffffa90,
                             in_stack_fffffffffffffa88);
  std::__cxx11::string::~string(local_f8);
  local_ac = local_ac + -1;
  local_d8 = TVar1;
  switch(TVar1) {
  case ttGhostTorsion:
    if (local_ac < 4) {
      local_11a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_11a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_128 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_130 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_138 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_140 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      pHVar3 = (HarmonicTorsionType *)operator_new(0x28);
      CubicTorsionType::CubicTorsionType
                ((CubicTorsionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88,
                 (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)in_stack_fffffffffffffa70);
      local_a8 = pHVar3;
    }
    else {
      pHVar3 = (HarmonicTorsionType *)operator_new(0x28);
      CubicTorsionType::CubicTorsionType
                ((CubicTorsionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88,
                 (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)in_stack_fffffffffffffa70);
      local_a8 = pHVar3;
    }
    break;
  case ttCubic:
    if (local_ac < 4) {
      local_162 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_162 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_170 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_178 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_180 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_188 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      pHVar3 = (HarmonicTorsionType *)operator_new(0x28);
      CubicTorsionType::CubicTorsionType
                ((CubicTorsionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88,
                 (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)in_stack_fffffffffffffa70);
      local_a8 = pHVar3;
    }
    else {
      pHVar3 = (HarmonicTorsionType *)operator_new(0x28);
      CubicTorsionType::CubicTorsionType
                ((CubicTorsionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88,
                 (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)in_stack_fffffffffffffa70);
      local_a8 = pHVar3;
    }
    break;
  case ttQuartic:
    if (local_ac < 5) {
      local_1aa = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_1aa = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_1b8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_1c0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_1c8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_1d0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_1d8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      pHVar3 = (HarmonicTorsionType *)operator_new(0x30);
      QuarticTorsionType::QuarticTorsionType
                ((QuarticTorsionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88
                 ,(RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_a8 = pHVar3;
    }
    else {
      pHVar3 = (HarmonicTorsionType *)operator_new(0x30);
      QuarticTorsionType::QuarticTorsionType
                ((QuarticTorsionType *)in_stack_fffffffffffffa90,(RealType)in_stack_fffffffffffffa88
                 ,(RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
                 (RealType)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_a8 = pHVar3;
    }
    break;
  case ttPolynomial:
    if ((local_ac < 2) || (local_ac % 2 != 0)) {
      local_1fa = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_1fa = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_200 = local_ac / 2;
    pHVar3 = (HarmonicTorsionType *)operator_new(0x38);
    PolynomialTorsionType::PolynomialTorsionType((PolynomialTorsionType *)in_stack_fffffffffffffa80)
    ;
    local_a8 = pHVar3;
    if (pHVar3 == (HarmonicTorsionType *)0x0) {
      local_4a8 = 0;
    }
    else {
      local_4a8 = __dynamic_cast(pHVar3,&TorsionType::typeinfo,&PolynomialTorsionType::typeinfo,0);
    }
    local_218 = local_4a8;
    for (local_21c = 0; local_21c < local_200; local_21c = local_21c + 1) {
      local_204 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffa90);
      local_21d = local_204 != (local_204 - ((int)local_204 >> 0x1f) & 0xfffffffe);
      local_210 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
      if (((*(byte *)(in_RDI + 0x30) & 1) == 0) && ((local_21d & 1) != 0)) {
        local_210 = -local_210;
      }
      PolynomialTorsionType::setCoefficient
                ((PolynomialTorsionType *)in_stack_fffffffffffffa70,
                 (int)((ulong)in_stack_fffffffffffffa68 >> 0x20),1.35497503371962e-317);
    }
    break;
  case ttCharmm:
    if ((local_ac < 3) || (local_ac % 3 != 0)) {
      local_242 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_242 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_248 = local_ac / 3;
    std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
    vector((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
            *)0x29da38);
    for (local_264 = 0; local_264 < local_248; local_264 = local_264 + 1) {
      local_280 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
      local_278 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffa90);
      RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
      local_270 = (RVar4 / 180.0) * 3.141592653589793;
      local_281 = -(local_278 != (local_278 - ((int)local_278 >> 0x1f) & 0xfffffffe)) & 1;
      if (((*(byte *)(in_RDI + 0x30) & 1) == 0) &&
         (local_270 = 3.141592653589793 - local_270, local_281 != 0)) {
        local_280 = -local_280;
      }
      std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
      push_back((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
                 *)in_stack_fffffffffffffa80,(value_type *)in_stack_fffffffffffffa78);
    }
    pHVar3 = (HarmonicTorsionType *)operator_new(0x70);
    CharmmTorsionType::CharmmTorsionType(in_stack_fffffffffffffbc0,in_stack_fffffffffffffbb8);
    local_a8 = pHVar3;
    std::vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>::
    ~vector((vector<OpenMD::CharmmTorsionParameter,_std::allocator<OpenMD::CharmmTorsionParameter>_>
             *)in_stack_fffffffffffffa80);
    break;
  case ttOpls:
    if (local_ac < 3) {
      local_2aa = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_2aa = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_2b8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    uVar6 = (undefined1)((ulong)in_stack_fffffffffffffaa0 >> 0x38);
    local_2c0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_2c8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    pHVar3 = (HarmonicTorsionType *)operator_new(0x50);
    OplsTorsionType::OplsTorsionType
              (in_stack_fffffffffffffac0,in_stack_fffffffffffffab8,
               (RealType)in_stack_fffffffffffffab0,(RealType)in_stack_fffffffffffffaa8,(bool)uVar6);
    local_a8 = pHVar3;
    break;
  case ttTrappe:
    if (local_ac < 4) {
      local_2ea = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
                 (allocator<char> *)in_stack_fffffffffffffaa0);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_2ea = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_2f8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_300 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    this_00 = (TrappeTorsionType *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_308 = this_00;
    RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    local_310 = RVar4;
    pHVar3 = (HarmonicTorsionType *)operator_new(0x58);
    TrappeTorsionType::TrappeTorsionType
              (this_00,RVar4,(RealType)pHVar3,(RealType)in_stack_fffffffffffffaa8,
               (RealType)in_stack_fffffffffffffaa0,(bool)uVar6);
    local_a8 = pHVar3;
    break;
  case ttHarmonic:
    if (local_ac < 2) {
      local_332 = 1;
      __a = (allocator<char> *)__cxa_allocate_exception(0x28);
      __s = local_331;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffab0->tokenString_,__s,__a);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
      local_332 = 0;
      __cxa_throw(__a,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_340 = 57.29577951308232;
    RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    __y = (int)((ulong)in_stack_fffffffffffffa68 >> 0x20);
    local_348 = RVar4 / local_340;
    RVar4 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffab0);
    _Var5 = std::pow<double,int>((double)in_stack_fffffffffffffa70,__y);
    local_350 = RVar4 * _Var5;
    if ((*(byte *)(in_RDI + 0x30) & 1) == 0) {
      local_348 = 3.141592653589793 - local_348;
    }
    pHVar3 = (HarmonicTorsionType *)operator_new(0x18);
    HarmonicTorsionType::HarmonicTorsionType
              (pHVar3,(RealType)in_stack_fffffffffffffa78,(RealType)in_stack_fffffffffffffa70);
    local_a8 = pHVar3;
    break;
  case ttUnknown:
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    msg = &local_371;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffab0->tokenString_,(char *)in_stack_fffffffffffffaa8,
               (allocator<char> *)in_stack_fffffffffffffaa0);
    OpenMDException::OpenMDException((OpenMDException *)in_stack_fffffffffffffa80,msg);
    __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffa70);
  return &local_a8->super_TorsionType;
}

Assistant:

TorsionType* TorsionTypeParser::parseLine(const std::string& line) {
    StringTokenizer tokenizer(line);
    TorsionType* torsionType = NULL;
    int nTokens              = tokenizer.countTokens();

    if (nTokens < 1) {
      throw OpenMDException("TorsionTypeParser: Not enough tokens");
    }

    TorsionTypeEnum tt = getTorsionTypeEnum(tokenizer.nextToken());

    nTokens -= 1;

    switch (tt) {
    case ttGhostTorsion:
      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new CubicTorsionType(k3, k2, k1, k0);
        else
          torsionType = new CubicTorsionType(-k3, k2, -k1, k0);
      }
      break;

    case ttCubic:
      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new CubicTorsionType(k3, k2, k1, k0);
        else
          torsionType = new CubicTorsionType(-k3, k2, -k1, k0);
      }
      break;

    case ttQuartic:
      if (nTokens < 5) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        if (trans180_)
          torsionType = new QuarticTorsionType(k4, k3, k2, k1, k0);
        else
          torsionType = new QuarticTorsionType(k4, -k3, k2, -k1, k0);
      }
      break;

    case ttPolynomial:
      if (nTokens < 2 || nTokens % 2 != 0) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        torsionType = new PolynomialTorsionType();

        PolynomialTorsionType* ptt =
            dynamic_cast<PolynomialTorsionType*>(torsionType);

        for (int i = 0; i < nPairs; ++i) {
          power      = tokenizer.nextTokenAsInt();
          bool isOdd = power % 2 == 0 ? false : true;

          coefficient = tokenizer.nextTokenAsDouble();

          if (!trans180_ && isOdd) coefficient = -coefficient;

          ptt->setCoefficient(power, coefficient);
        }
      }

      break;

    case ttCharmm:

      if (nTokens < 3 || nTokens % 3 != 0) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        int nSets = nTokens / 3;

        std::vector<CharmmTorsionParameter> parameters;
        for (int i = 0; i < nSets; ++i) {
          CharmmTorsionParameter currParam;
          currParam.kchi  = tokenizer.nextTokenAsDouble();
          currParam.n     = tokenizer.nextTokenAsInt();
          currParam.delta = tokenizer.nextTokenAsDouble() / 180.0 *
                            Constants::PI;  // convert to rad

          bool isOdd = currParam.n % 2 == 0 ? false : true;
          if (!trans180_) {
            currParam.delta = Constants::PI - currParam.delta;
            if (isOdd) currParam.kchi = -currParam.kchi;
          }

          parameters.push_back(currParam);
        }

        torsionType = new CharmmTorsionType(parameters);
      }

      break;

    case ttOpls:

      if (nTokens < 3) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType v1 = tokenizer.nextTokenAsDouble();
        RealType v2 = tokenizer.nextTokenAsDouble();
        RealType v3 = tokenizer.nextTokenAsDouble();

        torsionType = new OplsTorsionType(v1, v2, v3, trans180_);
      }

      break;

    case ttTrappe:

      if (nTokens < 4) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        RealType c0 = tokenizer.nextTokenAsDouble();
        RealType c1 = tokenizer.nextTokenAsDouble();
        RealType c2 = tokenizer.nextTokenAsDouble();
        RealType c3 = tokenizer.nextTokenAsDouble();
        torsionType = new TrappeTorsionType(c0, c1, c2, c3, trans180_);
      }

      break;

    case ttHarmonic:

      if (nTokens < 2) {
        throw OpenMDException("TorsionTypeParser: Not enough tokens");
      } else {
        // Most torsions don't have specific angle information since
        // they are cosine polynomials.  This one is different,
        // however.  To match our other force field files
        // (particularly for bends):
        //
        // phi0 should be read in degrees
        // d0 should be read in kcal / mol / degrees^2

        RealType degreesPerRadian = 180.0 / Constants::PI;

        // convert to radians
        RealType phi0 = tokenizer.nextTokenAsDouble() / degreesPerRadian;

        // convert to kcal / mol / radians^2
        RealType d0 = tokenizer.nextTokenAsDouble() * pow(degreesPerRadian, 2);

        if (!trans180_) phi0 = Constants::PI - phi0;

        torsionType = new HarmonicTorsionType(d0, phi0);
      }

      break;

    case ttUnknown:
    default:
      throw OpenMDException("TorsionTypeParser: Unknown Torsion Type");
    }
    return torsionType;
  }